

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O2

void helper_booke206_tlbre_ppc64(CPUPPCState_conflict2 *env)

{
  ppcmas_tlb_t *tlb;
  
  tlb = booke206_cur_tlb(env);
  if (tlb != (ppcmas_tlb_t *)0x0) {
    booke206_tlb_to_mas(env,tlb);
    return;
  }
  env->spr[0x271] = 0;
  return;
}

Assistant:

void helper_booke206_tlbre(CPUPPCState *env)
{
    ppcmas_tlb_t *tlb = NULL;

    tlb = booke206_cur_tlb(env);
    if (!tlb) {
        env->spr[SPR_BOOKE_MAS1] = 0;
    } else {
        booke206_tlb_to_mas(env, tlb);
    }
}